

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

__pid_t __thiscall kj::Executor::wait(Executor *this,void *__stat_loc)

{
  Vector<kj::_::XThreadEvent_*> *this_00;
  __pid_t extraout_EAX;
  Impl *pIVar1;
  State *this_01;
  Type *func;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> local_90;
  undefined1 local_7a [2];
  undefined1 local_78 [8];
  Locked<kj::Executor::Impl::State> lock;
  Maybe<kj::_::XThreadEvent_&> local_58;
  Vector<kj::_::XThreadEvent_*> *local_50;
  undefined1 local_48 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:1326:3)>
  _kjDefer1326;
  Vector<kj::_::XThreadEvent_*> eventsToCancelOutsideLock;
  Executor *this_local;
  
  this_00 = (Vector<kj::_::XThreadEvent_*> *)((long)&_kjDefer1326.maybeFunc.ptr.field_1 + 8);
  Vector<kj::_::XThreadEvent_*>::Vector(this_00);
  local_58.ptr = (XThreadEvent *)this;
  local_50 = this_00;
  defer<kj::Executor::wait()::__0>
            ((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:1326:3)>
              *)local_48,(kj *)&local_58,func);
  pIVar1 = Own<kj::Executor::Impl,_std::nullptr_t>::operator->(&this->impl);
  MutexGuarded<kj::Executor::Impl::State>::lockExclusive
            ((MutexGuarded<kj::Executor::Impl::State> *)local_78,pIVar1);
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::Maybe(&local_90);
  Locked<kj::Executor::Impl::State>::wait<kj::Executor::wait()::__1>
            ((Locked<kj::Executor::Impl::State> *)local_78,local_7a,&local_90);
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::~Maybe(&local_90);
  this_01 = Locked<kj::Executor::Impl::State>::operator->
                      ((Locked<kj::Executor::Impl::State> *)local_78);
  Impl::State::dispatchAll
            (this_01,(Vector<kj::_::XThreadEvent_*> *)
                     ((long)&_kjDefer1326.maybeFunc.ptr.field_1 + 8));
  Locked<kj::Executor::Impl::State>::~Locked((Locked<kj::Executor::Impl::State> *)local_78);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:1326:3)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:1326:3)>
               *)local_48);
  Vector<kj::_::XThreadEvent_*>::~Vector
            ((Vector<kj::_::XThreadEvent_*> *)((long)&_kjDefer1326.maybeFunc.ptr.field_1 + 8));
  return extraout_EAX;
}

Assistant:

void Executor::wait() {
  Vector<_::XThreadEvent*> eventsToCancelOutsideLock;
  KJ_DEFER(impl->processAsyncCancellations(eventsToCancelOutsideLock));

  auto lock = impl->state.lockExclusive();

  lock.wait([](const Impl::State& state) {
    return state.isDispatchNeeded();
  });

  lock->dispatchAll(eventsToCancelOutsideLock);
}